

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_3d73a9::ArgParser::argEndEncryption(ArgParser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  QPDFJob::EncConfig::endEncrypt
            ((this->c_enc).super___shared_ptr<QPDFJob::EncConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  this_00 = (this->c_enc).super___shared_ptr<QPDFJob::EncConfig,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->c_enc).super___shared_ptr<QPDFJob::EncConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->c_enc).super___shared_ptr<QPDFJob::EncConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

void
ArgParser::argEndEncryption()
{
    c_enc->endEncrypt();
    c_enc = nullptr;
}